

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_deltaeta_chdep
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_p_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_m_rap_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_ss_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_ss_eta12_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_os_eta12,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *C_n2_os_eta12_err)

{
  int iVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pvVar7;
  long lVar8;
  pointer pdVar9;
  pointer pdVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  allocator_type local_f2;
  allocator_type local_f1;
  pointer local_f0;
  pointer local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_os_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_err;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_os_1;
  value_type_conflict local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_ss_2;
  vector<double,_std::allocator<double>_> local_78;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp_Cn2_ss_1;
  
  iVar1 = this->order_max;
  temp_Cn2_os_1.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0 = (pointer)C_n2_ss_eta12;
  local_e8 = (pointer)event_Qn_m_rap_imag;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cn2_ss_2,(long)this->N_rap,
             (value_type_conflict *)&temp_Cn2_os_1,(allocator_type *)&temp_Cn2_os_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cn2_ss_1,(long)iVar1,(value_type *)&temp_Cn2_ss_2,(allocator_type *)&temp_Cn2_err);
  if (temp_Cn2_ss_2.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_ss_2.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->order_max;
  temp_Cn2_os_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cn2_os_1,(long)this->N_rap,
             (value_type_conflict *)&temp_Cn2_os_2,(allocator_type *)&temp_Cn2_err);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cn2_ss_2,(long)iVar1,(value_type *)&temp_Cn2_os_1,(allocator_type *)&local_78);
  if (temp_Cn2_os_1.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_os_1.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->order_max;
  temp_Cn2_err.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cn2_os_2,(long)this->N_rap,
             (value_type_conflict *)&temp_Cn2_err,(allocator_type *)&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cn2_os_1,(long)iVar1,(value_type *)&temp_Cn2_os_2,(allocator_type *)&local_98);
  if (temp_Cn2_os_2.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_os_2.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->order_max;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp_Cn2_err,(long)this->N_rap,
             (value_type_conflict *)&local_78,(allocator_type *)&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cn2_os_2,(long)iVar1,(value_type *)&temp_Cn2_err,&local_f2);
  if (temp_Cn2_err.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_err.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = this->order_max;
  local_98 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_78,(long)this->N_rap,&local_98,(allocator_type *)&local_f2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp_Cn2_err,(long)iVar1,&local_78,&local_f1);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_p_rap_real,event_Qn_p_rap_imag,0,
             &temp_Cn2_ss_1,&temp_Cn2_err);
  pvVar3 = local_e8;
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this,event_Qn_m_rap_real,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_e8,event_Qn_m_rap_real,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_e8,0,&temp_Cn2_ss_2,&temp_Cn2_err);
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this,event_Qn_p_rap_real,event_Qn_p_rap_imag,event_Qn_m_rap_real,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)pvVar3,1,&temp_Cn2_os_1,&temp_Cn2_err);
  calculate_two_particle_correlation_deltaeta_chdep_base
            (this,event_Qn_m_rap_real,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)pvVar3,event_Qn_p_rap_real,event_Qn_p_rap_imag,1,&temp_Cn2_os_2,&temp_Cn2_err);
  iVar1 = this->order_max;
  if (0 < (long)iVar1) {
    uVar2 = this->N_rap;
    local_e8 = temp_Cn2_ss_1.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_50 = temp_Cn2_ss_2.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = (((_Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&local_f0->super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
               super__Vector_impl_data._M_start;
    local_58 = (C_n2_ss_eta12_err->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_60 = temp_Cn2_os_1.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (C_n2_os_eta12->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (C_n2_os_eta12_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar5 = temp_Cn2_ss_1.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar6 = temp_Cn2_ss_2.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pvVar7 = (((_Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&local_f0[lVar14].super__Vector_base<double,_std::allocator<double>_>)->
                 _M_impl).super__Vector_impl_data._M_start;
        lVar8 = *(long *)&local_58[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data;
        pdVar9 = temp_Cn2_os_1.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar10 = temp_Cn2_os_2.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar11 = *(long *)&pvVar3[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar12 = *(long *)&pvVar4[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar13 = 0;
        do {
          dVar15 = pdVar5[uVar13] + pdVar6[uVar13];
          *(double *)
           ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data + uVar13 * 8) =
               *(double *)
                ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + uVar13 * 8) + dVar15;
          *(double *)(lVar8 + uVar13 * 8) = dVar15 * dVar15 + *(double *)(lVar8 + uVar13 * 8);
          dVar15 = pdVar9[uVar13] + pdVar10[uVar13];
          *(double *)(lVar11 + uVar13 * 8) = *(double *)(lVar11 + uVar13 * 8) + dVar15;
          *(double *)(lVar12 + uVar13 * 8) = dVar15 * dVar15 + *(double *)(lVar12 + uVar13 * 8);
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != iVar1);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cn2_err);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cn2_os_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cn2_os_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cn2_ss_2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp_Cn2_ss_1);
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_deltaeta_chdep(
    vector<vector<double>> &event_Qn_p_rap_real,
    vector<vector<double>> &event_Qn_p_rap_imag,
    vector<vector<double>> &event_Qn_m_rap_real,
    vector<vector<double>> &event_Qn_m_rap_imag,
    vector<vector<double>> &C_n2_ss_eta12,
    vector<vector<double>> &C_n2_ss_eta12_err,
    vector<vector<double>> &C_n2_os_eta12,
    vector<vector<double>> &C_n2_os_eta12_err) {
    vector<vector<double>> temp_Cn2_ss_1(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_ss_2(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_os_1(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_os_2(order_max, vector<double>(N_rap, 0.));
    vector<vector<double>> temp_Cn2_err(order_max, vector<double>(N_rap, 0.));

    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, 0, temp_Cn2_ss_1, temp_Cn2_err);
    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, 0, temp_Cn2_ss_2, temp_Cn2_err);
    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_p_rap_real, event_Qn_p_rap_imag, event_Qn_m_rap_real,
        event_Qn_m_rap_imag, 1, temp_Cn2_os_1, temp_Cn2_err);
    calculate_two_particle_correlation_deltaeta_chdep_base(
        event_Qn_m_rap_real, event_Qn_m_rap_imag, event_Qn_p_rap_real,
        event_Qn_p_rap_imag, 1, temp_Cn2_os_2, temp_Cn2_err);

    for (int i = 0; i < order_max; i++) {
        for (int j = 0; j < N_rap; j++) {
            double temp_ss = temp_Cn2_ss_1[i][j] + temp_Cn2_ss_2[i][j];
            C_n2_ss_eta12[i][j] += temp_ss;
            C_n2_ss_eta12_err[i][j] += temp_ss * temp_ss;
            double temp_os = temp_Cn2_os_1[i][j] + temp_Cn2_os_2[i][j];
            C_n2_os_eta12[i][j] += temp_os;
            C_n2_os_eta12_err[i][j] += temp_os * temp_os;
        }
    }
}